

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O1

void __thiscall
RateCodingSynapse::initialize(RateCodingSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  int iVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  _Map_pointer ppdVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  double *pdVar8;
  allocator_type local_81;
  _Deque_base<double,_std::allocator<double>_> local_80;
  
  iVar2 = (*n_from->_vptr_Population[3])(n_from);
  this->inputSize = iVar2;
  iVar2 = (*n_to->_vptr_Population[2])(n_to);
  this->outputSize = iVar2;
  if (iVar2 == 1) {
    this->singleOutput = true;
  }
  else if (this->inputSize != iVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Number of input neurons not equal to number of output neurons");
    std::endl<char,std::char_traits<char>>(poVar6);
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar7,&char_const*::typeinfo,0);
  }
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  this->logger = pLVar4;
  if (0 < this->inputSize) {
    iVar2 = 0;
    do {
      ppdVar5 = (_Map_pointer)operator_new(0x20);
      *ppdVar5 = (double *)&PTR_setWeight_00127b60;
      ppdVar5[3] = (double *)0x0;
      *(undefined4 *)(ppdVar5 + 1) = 3;
      pCVar3 = Clock::getInstance();
      pdVar8 = (double *)Clock::getCurrentTime(pCVar3);
      ppdVar5[2] = pdVar8;
      local_80._M_impl.super__Deque_impl_data._M_map = ppdVar5;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_80);
      iVar1 = this->inputSize;
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)&local_80,0,&local_81);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::_M_fill_assign(&this->spikes,(long)iVar1,(value_type *)&local_80);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_80);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->inputSize);
  }
  return;
}

Assistant:

void RateCodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfInputNeurons();
    if(outputSize == 1) {
        singleOutput = true;
    }
    else if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        spikes.assign(inputSize, deque<double>(0));
    }
}